

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Factory.cpp
# Opt level: O0

ElementPtr __thiscall
Rml::Factory::InstanceDocumentStream
          (Factory *this,Context *context,Stream *stream,String *document_base_tag)

{
  bool bVar1;
  pointer pEVar2;
  type var;
  char *pcVar3;
  undefined1 local_180 [8];
  XMLParser parser;
  ElementDocument *document;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_48;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> local_30;
  ElementPtr element;
  String *document_base_tag_local;
  Stream *stream_local;
  Context *context_local;
  
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl =
       (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
       (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)document_base_tag;
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::flat_map(&local_48);
  InstanceElement((Factory *)&local_30,(Element *)0x0,document_base_tag,document_base_tag,&local_48)
  ;
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::~flat_map(&local_48);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_30);
  if (bVar1) {
    pEVar2 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(&local_30);
    parser.stack.c.
    super__Deque_base<Rml::XMLParser::ParseFrame,_std::allocator<Rml::XMLParser::ParseFrame>_>.
    _M_impl.super__Deque_impl_data._M_finish._M_node =
         (_Map_pointer)rmlui_dynamic_cast<Rml::ElementDocument*,Rml::Element*>(pEVar2);
    if ((ElementDocument *)
        parser.stack.c.
        super__Deque_base<Rml::XMLParser::ParseFrame,_std::allocator<Rml::XMLParser::ParseFrame>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_node == (ElementDocument *)0x0) {
      var = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator*(&local_30);
      pcVar3 = rmlui_type_name<Rml::Element>(var);
      Log::Message(LT_ERROR,
                   "Failed to instance document element. Found type \'%s\', was expecting derivative of ElementDocument."
                   ,pcVar3);
      ::std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>::
      unique_ptr<Rml::Releaser<Rml::Element>,void>
                ((unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>> *)this,(nullptr_t)0x0);
    }
    else {
      ((ElementDocument *)
      parser.stack.c.
      super__Deque_base<Rml::XMLParser::ParseFrame,_std::allocator<Rml::XMLParser::ParseFrame>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_node)->context = context;
      pEVar2 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(&local_30);
      XMLParser::XMLParser((XMLParser *)local_180,pEVar2);
      BaseXMLParser::Parse((BaseXMLParser *)local_180,stream);
      ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::unique_ptr
                ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)this,&local_30);
      XMLParser::~XMLParser((XMLParser *)local_180);
    }
  }
  else {
    Log::Message(LT_ERROR,"Failed to instance document, instancer returned nullptr.");
    ::std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>::
    unique_ptr<Rml::Releaser<Rml::Element>,void>
              ((unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>> *)this,(nullptr_t)0x0);
  }
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_30);
  return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
}

Assistant:

ElementPtr Factory::InstanceDocumentStream(Context* context, Stream* stream, const String& document_base_tag)
{
	RMLUI_ZoneScoped;

	ElementPtr element = Factory::InstanceElement(nullptr, document_base_tag, document_base_tag, XMLAttributes());
	if (!element)
	{
		Log::Message(Log::LT_ERROR, "Failed to instance document, instancer returned nullptr.");
		return nullptr;
	}

	ElementDocument* document = rmlui_dynamic_cast<ElementDocument*>(element.get());
	if (!document)
	{
		Log::Message(Log::LT_ERROR, "Failed to instance document element. Found type '%s', was expecting derivative of ElementDocument.",
			rmlui_type_name(*element));
		return nullptr;
	}

	document->context = context;

	XMLParser parser(element.get());
	parser.Parse(stream);

	return element;
}